

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O0

void __thiscall amrex::TagBoxArray::setVal(TagBoxArray *this,BoxArray *ba,TagVal val)

{
  undefined1 uVar1;
  bool bVar2;
  undefined4 in_EDX;
  MFIter *in_RSI;
  undefined8 in_RDI;
  Box *b;
  pair<int,_amrex::Box> *is;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *__range3;
  Array4<char> *arr;
  TagBox *fab;
  MFIter mfi;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  bool run_on_gpu;
  Vector<amrex::Array4BoxTag<char>,_std::allocator<amrex::Array4BoxTag<char>_>_> tags;
  MFIter *in_stack_fffffffffffffe18;
  FabArray<amrex::TagBox> *in_stack_fffffffffffffe20;
  MFIter *in_stack_fffffffffffffe28;
  FabArray<amrex::TagBox> *in_stack_fffffffffffffe30;
  undefined6 in_stack_fffffffffffffe40;
  uchar in_stack_fffffffffffffe47;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> in_stack_fffffffffffffe48;
  FabArrayBase *in_stack_fffffffffffffe50;
  Box *in_stack_fffffffffffffe58;
  BoxArray *in_stack_fffffffffffffe60;
  __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
  local_140;
  undefined1 *local_138;
  undefined1 local_12c [92];
  MFIter *local_d0;
  TagBox *local_c8;
  undefined1 local_c0 [192];
  
  local_c0._172_4_ = in_EDX;
  local_c0._176_8_ = in_RSI;
  Vector<amrex::Array4BoxTag<char>,_std::allocator<amrex::Array4BoxTag<char>_>_>::Vector
            ((Vector<amrex::Array4BoxTag<char>,_std::allocator<amrex::Array4BoxTag<char>_>_> *)
             0x1360f18);
  uVar1 = Gpu::inLaunchRegion();
  local_c0[0x8f] = uVar1;
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             0x1360f3d);
  MFIter::MFIter((MFIter *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48._M_head_impl,
                 in_stack_fffffffffffffe47);
  while( true ) {
    bVar2 = MFIter::isValid((MFIter *)local_c0);
    if (!bVar2) break;
    in_stack_fffffffffffffe20 = (FabArray<amrex::TagBox> *)local_c0;
    local_c8 = FabArray<amrex::TagBox>::operator[]
                         (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe18 = (MFIter *)(local_12c + 0x1c);
    FabArray<amrex::TagBox>::array<amrex::TagBox,_0>
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe30 = (FabArray<amrex::TagBox> *)local_12c;
    in_stack_fffffffffffffe28 = (MFIter *)local_c0._176_8_;
    local_d0 = in_stack_fffffffffffffe18;
    MFIter::fabbox((MFIter *)in_stack_fffffffffffffe30);
    BoxArray::intersections
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               in_stack_fffffffffffffe50);
    local_138 = local_c0 + 0x60;
    local_140._M_current =
         (pair<int,_amrex::Box> *)
         std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
         begin((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               in_stack_fffffffffffffe18);
    std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::end
              ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               in_stack_fffffffffffffe18);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                          *)in_stack_fffffffffffffe20,
                         (__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                          *)in_stack_fffffffffffffe18);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
      ::operator*(&local_140);
      if ((local_c0[0x8f] & 1) == 0) {
        BaseFab<char>::setVal<(amrex::RunOn)1>
                  ((BaseFab<char> *)in_stack_fffffffffffffe50,
                   (char *)in_stack_fffffffffffffe48._M_head_impl,
                   (Box *)CONCAT17((char)local_c0._172_4_,CONCAT16(uVar1,in_stack_fffffffffffffe40))
                   ,(int)((ulong)in_RDI >> 0x20));
      }
      else {
        in_stack_fffffffffffffe48._M_head_impl =
             (local_d0->m_fa)._M_t.
             super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
             _M_t.
             super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
             .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
        in_stack_fffffffffffffe50 = local_d0->fabArray;
        in_stack_fffffffffffffe58 = *(Box **)(local_d0->tile_size).vect;
        in_stack_fffffffffffffe60 = *(BoxArray **)((local_d0->tile_size).vect + 2);
        std::vector<amrex::Array4BoxTag<char>,_std::allocator<amrex::Array4BoxTag<char>_>_>::
        push_back((vector<amrex::Array4BoxTag<char>,_std::allocator<amrex::Array4BoxTag<char>_>_> *)
                  in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
      ::operator++(&local_140);
    }
    MFIter::operator++((MFIter *)local_c0);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffffe20);
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             in_stack_fffffffffffffe30);
  Vector<amrex::Array4BoxTag<char>,_std::allocator<amrex::Array4BoxTag<char>_>_>::~Vector
            ((Vector<amrex::Array4BoxTag<char>,_std::allocator<amrex::Array4BoxTag<char>_>_> *)
             0x136119e);
  return;
}

Assistant:

void
TagBoxArray::setVal (const BoxArray& ba, TagBox::TagVal val)
{
    Vector<Array4BoxTag<char> > tags;
    bool run_on_gpu = Gpu::inLaunchRegion();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!run_on_gpu)
#endif
    {
        std::vector< std::pair<int,Box> > isects;
        for (MFIter mfi(*this); mfi.isValid(); ++mfi)
        {
            TagBox& fab = (*this)[mfi];
            Array4<char> const& arr = this->array(mfi);
            ba.intersections(mfi.fabbox(), isects);
            for (const auto& is : isects) {
                Box const& b = is.second;
                if (run_on_gpu) {
                    tags.push_back({arr,b});
                } else {
                   fab.setVal<RunOn::Host>(val,b);
                }
            }
        }
    }

#ifdef AMREX_USE_GPU
    amrex::ParallelFor(tags, 1,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int /*n*/, Array4BoxTag<char> const& tag) noexcept
    {
        tag.dfab(i,j,k) = val;
    });
#endif
}